

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void ar_predict(ar_object obj,double *inp,int L,double *xpred,double *amse)

{
  double dVar1;
  int N;
  uint ip;
  double *pdVar2;
  undefined8 *__ptr;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  long lVar3;
  long lVar4;
  ulong uVar5;
  size_t __size;
  
  N = obj->N;
  lVar4 = (long)N;
  ip = obj->p;
  __ptr = (undefined8 *)malloc(8);
  W = (double *)malloc(lVar4 * 8);
  resid = (double *)malloc(lVar4 * 8);
  uVar5 = 1;
  if (1 < (int)ip) {
    uVar5 = (ulong)ip;
  }
  __size = uVar5 << 3;
  phi = (double *)malloc(__size);
  theta = (double *)malloc(__size);
  *__ptr = 0x3ff0000000000000;
  dVar1 = obj->mean;
  if (0 < lVar4) {
    pdVar2 = obj->res;
    lVar3 = 0;
    do {
      W[lVar3] = inp[lVar3] - dVar1;
      resid[lVar3] = pdVar2[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  memset(theta,0,__size);
  memset(phi,0,__size);
  if (0 < (int)ip) {
    pdVar2 = obj->phi;
    uVar5 = 0;
    do {
      phi[uVar5] = pdVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (ip != uVar5);
  }
  forkal(ip,0,0,phi,theta,(double *)(__ptr + 1),N,W,resid,L,xpred,amse);
  if (0 < L) {
    uVar5 = 0;
    do {
      xpred[uVar5] = xpred[uVar5] + dVar1;
      uVar5 = uVar5 + 1;
    } while ((uint)L != uVar5);
  }
  free(__ptr);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void ar_predict(ar_object obj, double *inp, int L, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir;
	double *delta, *W, *resid, *phi, *theta;
	double wmean;

	d = 0;
	N = obj->N;
	ip = obj->p;
	iq = 0;
	delta = (double*)malloc(sizeof(double)* (d + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	if (d > 0) {
		deld(d, delta);
	}
	else {
		*delta = 1.0;
		wmean = obj->mean;
	}
	for (i = 1; i <= d; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0) {
			W[i] -= wmean;
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < ip; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = -1.0 *  0.0;
	}

	forkal(ip, iq, d, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
	}

	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}